

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator.cpp
# Opt level: O3

void __thiscall
helics::Translator::setTranslatorOperations
          (Translator *this,shared_ptr<helics::TranslatorOperations> *translatorOps)

{
  uint uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Core *pCVar2;
  element_type *peVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined8 local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  uVar4 = *(undefined4 *)
           &(translatorOps->
            super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar5 = *(undefined4 *)
           ((long)&(translatorOps->
                   super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr + 4);
  uVar6 = *(undefined4 *)
           &(translatorOps->
            super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  uVar7 = *(undefined4 *)
           ((long)&(translatorOps->
                   super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi + 4);
  (translatorOps->super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>).
  _M_ptr = (element_type *)0x0;
  (translatorOps->super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (this->transOp).
            super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi;
  *(undefined4 *)
   &(this->transOp).super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = uVar4;
  *(undefined4 *)
   ((long)&(this->transOp).
           super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4)
       = uVar5;
  *(undefined4 *)
   &(this->transOp).super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = uVar6;
  *(undefined4 *)
   ((long)&(this->transOp).
           super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi + 4) = uVar7;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pCVar2 = (this->super_Interface).mCore;
  if (pCVar2 != (Core *)0x0) {
    uVar1 = (this->super_Interface).handle.hid;
    peVar3 = (this->transOp).
             super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar3 == (element_type *)0x0) {
      local_28 = 0;
      p_Stack_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      (*peVar3->_vptr_TranslatorOperations[4])(&local_28);
    }
    (*pCVar2->_vptr_Core[0x55])(pCVar2,(ulong)uVar1,&local_28);
    if (p_Stack_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_20);
    }
  }
  return;
}

Assistant:

void Translator::setTranslatorOperations(std::shared_ptr<TranslatorOperations> translatorOps)
{
    transOp = std::move(translatorOps);
    if (mCore != nullptr) {
        mCore->setTranslatorOperator(handle, (transOp) ? transOp->getOperator() : nullptr);
    }
}